

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void hessenberg(double *A,int N)

{
  size_t __size;
  int iVar1;
  int n;
  double *x;
  double *v;
  double *A_00;
  double *C;
  double *pdVar2;
  long lVar3;
  ulong uVar4;
  int m;
  int N_00;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  double alpha;
  long local_78;
  ulong local_60;
  double *local_58;
  double *local_50;
  
  lVar11 = (long)N;
  __size = lVar11 * 8;
  x = (double *)malloc(__size);
  v = (double *)malloc(__size);
  A_00 = (double *)malloc(__size * lVar11);
  C = (double *)malloc(__size);
  uVar7 = 0;
  uVar8 = 0;
  if (0 < N) {
    uVar8 = (ulong)(uint)N;
  }
  iVar1 = 2;
  if (2 < N) {
    iVar1 = N;
  }
  uVar12 = (ulong)(uint)N;
  local_58 = A + lVar11;
  uVar10 = N - 1;
  lVar9 = lVar11 << 0x20;
  local_60 = 1;
  uVar13 = uVar12;
  local_50 = A;
  local_78 = lVar9;
  for (; local_78 = local_78 + -0x100000000, uVar7 != iVar1 - 2; uVar7 = uVar7 + 1) {
    pdVar2 = local_58;
    for (lVar3 = 0; (long)(local_60 + lVar3) < lVar11; lVar3 = lVar3 + 1) {
      x[lVar3] = *pdVar2;
      pdVar2 = pdVar2 + lVar11;
    }
    m = N - (uint)uVar7;
    N_00 = m + -1;
    n = ~(uint)uVar7 + N;
    alpha = house(x,N_00,v);
    lVar3 = 0;
    pdVar2 = local_58;
    for (uVar4 = local_60; uVar4 != uVar12; uVar4 = uVar4 + 1) {
      lVar5 = lVar3;
      for (uVar6 = 0; uVar13 != uVar6; uVar6 = uVar6 + 1) {
        *(double *)((long)A_00 + (lVar5 >> 0x1d)) = pdVar2[uVar6];
        lVar5 = lVar5 + ((ulong)uVar10 << 0x20);
      }
      pdVar2 = pdVar2 + lVar11;
      lVar3 = lVar3 + 0x100000000;
    }
    mmult(A_00,v,C,m,n,1);
    scale(C,m,1,alpha);
    mmult(v,C,A_00,n,1,m);
    lVar3 = 0;
    pdVar2 = local_58;
    for (uVar4 = local_60; uVar4 != uVar12; uVar4 = uVar4 + 1) {
      lVar5 = lVar3;
      for (uVar6 = 0; uVar13 != uVar6; uVar6 = uVar6 + 1) {
        pdVar2[uVar6] = pdVar2[uVar6] - *(double *)((long)A_00 + (lVar5 >> 0x1d));
        lVar5 = lVar5 + 0x100000000;
      }
      pdVar2 = pdVar2 + lVar11;
      lVar3 = lVar3 + lVar9;
    }
    lVar3 = 0;
    pdVar2 = local_50;
    for (uVar4 = 0; uVar4 != uVar8; uVar4 = uVar4 + 1) {
      lVar5 = lVar3;
      for (uVar6 = 1; uVar13 != uVar6; uVar6 = uVar6 + 1) {
        *(double *)((long)A_00 + (lVar5 >> 0x1d)) = pdVar2[uVar6];
        lVar5 = lVar5 + 0x100000000;
      }
      pdVar2 = pdVar2 + lVar11;
      lVar3 = lVar3 + local_78;
    }
    mmult(A_00,v,C,N,N_00,1);
    scale(C,N,1,alpha);
    mmult(C,v,A_00,N,1,N_00);
    lVar3 = 0;
    pdVar2 = local_50;
    for (uVar4 = 0; uVar4 != uVar8; uVar4 = uVar4 + 1) {
      lVar5 = lVar3;
      for (uVar6 = 1; uVar13 != uVar6; uVar6 = uVar6 + 1) {
        pdVar2[uVar6] = pdVar2[uVar6] - *(double *)((long)A_00 + (lVar5 >> 0x1d));
        lVar5 = lVar5 + 0x100000000;
      }
      pdVar2 = pdVar2 + lVar11;
      lVar3 = lVar3 + local_78;
    }
    local_60 = local_60 + 1;
    local_58 = local_58 + lVar11 + 1;
    uVar13 = uVar13 - 1;
    uVar10 = uVar10 - 1;
    lVar9 = lVar9 + -0x100000000;
    local_50 = local_50 + 1;
  }
  free(x);
  free(v);
  free(A_00);
  free(C);
  return;
}

Assistant:

void hessenberg(double *A,int N) {
	int k,i,j,t,u;
	double *x,*v,*AT,*w;
	double beta;
	x = (double*) malloc(sizeof(double) * N);
	v = (double*) malloc(sizeof(double) * N);
	AT = (double*) malloc(sizeof(double) * N * N);
	w = (double*) malloc(sizeof(double) * N);
	
	for (k = 0; k < N-2;++k) {
		for(i=k + 1;i < N;++i) {
			x[i-k-1] = A[i*N+k];
			//printf("x %lf \n",x[i-k-1]);
			
		}
		
		beta = house(x,N-k-1,v);
		
		
		for (i=k+1; i < N; i++) {
			t = i * N;
			u = 0;
			for (j=k; j < N; j++) {
				AT[u+i-k-1] = A[j+t];
				u+=(N-k-1);				
			}
		}
		//mdisplay(AT,N-k,N-k-1);
		
		
		mmult(AT,v,w,N-k,N-k-1,1);
		scale(w,N-k,1,beta);
		mmult(v,w,AT,N-k-1,1,N-k);
		//mdisplay(AT,N-k-1,N-k);
		
		for (i=k+1; i < N; i++) {
			t = i * N;
			for (j=k; j < N; j++) {
				A[t+j] -= AT[(i-k-1)*(N-k) + j - k];
			}
		}
		//mdisplay(A,N,N);
		
		for (i=0; i < N; i++) {
			t = i * N;
			u = i * (N-k-1);
			for (j=k+1; j < N; j++) {
				AT[u+j-k-1] = A[t+j];
			}
		}
		//mdisplay(AT,N,N-k-1);
		
		mmult(AT,v,w,N,N-k-1,1);
		scale(w,N,1,beta);
		mmult(w,v,AT,N,1,N-k-1);
		//mdisplay(AT,N,N-k-1);
		
		for (i=0; i < N; i++) {
			t = i * N;
			u = i * (N-k-1);
			for (j=k+1; j < N; j++) {
				A[t+j] -= AT[u+j-k-1];
			}
		}
		
	}
	
	free(x);
	free(v);
	free(AT);
	free(w);
}